

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O0

_Bool Hacl_RSAPSS_rsapss_skey_sign
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint32_t dBits,
                uint8_t *nb,uint8_t *eb,uint8_t *db,uint32_t saltLen,uint8_t *salt,uint32_t msgLen,
                uint8_t *msg,uint8_t *sgnt)

{
  long lVar1;
  uint8_t *eb_00;
  uint8_t *nb_00;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Spec_Hash_Definitions_hash_alg a_00;
  ulong uVar5;
  uint64_t *puVar6;
  undefined8 auStack_80 [2];
  uint32_t auStack_70 [2];
  uint64_t auStack_68 [3];
  uint64_t *local_50;
  _Bool local_41;
  long lStack_40;
  _Bool b;
  unsigned_long __vla_expr0;
  uint8_t *local_30;
  uint8_t *eb_local;
  uint8_t *nb_local;
  uint32_t dBits_local;
  uint32_t eBits_local;
  uint32_t modBits_local;
  Spec_Hash_Definitions_hash_alg a_local;
  
  __vla_expr0 = (unsigned_long)(auStack_68 + 2);
  local_30 = eb;
  eb_local = nb;
  nb_local._0_4_ = dBits;
  nb_local._4_4_ = eBits;
  dBits_local = modBits;
  eBits_local._2_1_ = a;
  if (0x1fffffffffffffff <
      (ulong)(((modBits - 1 >> 6) + 1) * 2 + (eBits - 1 >> 6) + (dBits - 1 >> 6) + 2)) {
    auStack_68[1] = 0x27184b;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_RSAPSS.c"
           ,0x325);
    auStack_68[1] = 0x271855;
    exit(0xfd);
  }
  uVar5 = (ulong)((eBits - 1 >> 6) + (modBits - 1 >> 6) * 2 + (dBits - 1 >> 6));
  lStack_40 = uVar5 + 4;
  lVar1 = -(uVar5 * 8 + 0x2f & 0xffffffff0);
  puVar6 = (uint64_t *)((long)auStack_68 + lVar1 + 0x10);
  local_50 = puVar6;
  *(undefined8 *)((long)auStack_68 + lVar1 + 8) = 0x2718e7;
  memset(puVar6,0,(ulong)(((modBits - 1 >> 6) + 1) * 2 + (eBits - 1 >> 6) + (dBits - 1 >> 6) + 2) <<
                  3);
  uVar4 = dBits_local;
  uVar3 = nb_local._4_4_;
  uVar2 = (uint32_t)nb_local;
  nb_00 = eb_local;
  eb_00 = local_30;
  *(uint64_t **)((long)auStack_68 + lVar1) = local_50;
  *(undefined8 *)((long)auStack_70 + lVar1) = 0x27190d;
  local_41 = load_skey(uVar4,uVar3,uVar2,nb_00,eb_00,db,*(uint64_t **)((long)auStack_68 + lVar1));
  a_00 = eBits_local._2_1_;
  uVar4 = dBits_local;
  uVar3 = nb_local._4_4_;
  uVar2 = (uint32_t)nb_local;
  puVar6 = local_50;
  if (local_41) {
    *(uint8_t **)((long)auStack_80 + lVar1 + 8) = salt;
    *(uint32_t *)((long)auStack_70 + lVar1) = msgLen;
    *(uint8_t **)((long)auStack_68 + lVar1) = msg;
    *(uint8_t **)((long)auStack_68 + lVar1 + 8) = sgnt;
    *(undefined8 *)((long)auStack_80 + lVar1) = 0x271961;
    eBits_local._3_1_ =
         Hacl_RSAPSS_rsapss_sign
                   (a_00,uVar4,uVar3,uVar2,puVar6,saltLen,
                    *(uint8_t **)((long)auStack_80 + lVar1 + 8),
                    *(uint32_t *)((long)auStack_70 + lVar1),*(uint8_t **)((long)auStack_68 + lVar1),
                    *(uint8_t **)((long)auStack_68 + lVar1 + 8));
  }
  else {
    eBits_local._3_1_ = false;
  }
  return eBits_local._3_1_;
}

Assistant:

bool
Hacl_RSAPSS_rsapss_skey_sign(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint32_t dBits,
  uint8_t *nb,
  uint8_t *eb,
  uint8_t *db,
  uint32_t saltLen,
  uint8_t *salt,
  uint32_t msgLen,
  uint8_t *msg,
  uint8_t *sgnt
)
{
  KRML_CHECK_SIZE(sizeof (uint64_t),
    2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U + (dBits - 1U) / 64U + 1U);
  uint64_t
  skey[2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U + (dBits - 1U) / 64U + 1U];
  memset(skey,
    0U,
    (2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U + (dBits - 1U) / 64U + 1U)
    * sizeof (uint64_t));
  bool b = load_skey(modBits, eBits, dBits, nb, eb, db, skey);
  if (b)
  {
    return
      Hacl_RSAPSS_rsapss_sign(a,
        modBits,
        eBits,
        dBits,
        skey,
        saltLen,
        salt,
        msgLen,
        msg,
        sgnt);
  }
  return false;
}